

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImpl::processJoystickEvents(WindowImpl *this)

{
  iterator *piVar1;
  byte bVar2;
  bool bVar3;
  _Elt_pointer pEVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined3 uVar8;
  float *pfVar9;
  JoystickState *pJVar10;
  JoystickManager *pJVar11;
  JoystickState *pJVar12;
  JoystickCaps *pJVar13;
  float (*pafVar14) [8];
  long lVar15;
  uint j;
  ulong uVar16;
  byte *pbVar17;
  JoystickState *pJVar18;
  bool *pbVar19;
  ulong uVar20;
  float (*pafVar21) [8];
  uint joystick;
  long lVar22;
  byte bVar23;
  float fVar24;
  Event event;
  JoystickCaps caps;
  JoystickState previousState;
  Event local_c4;
  long local_b0;
  deque<sf::Event,std::allocator<sf::Event>> *local_a8;
  float *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  float (*local_88) [8];
  JoystickState *local_80;
  byte local_74 [36];
  byte abStack_50 [32];
  
  bVar23 = 0;
  pJVar11 = JoystickManager::getInstance();
  JoystickManager::update(pJVar11);
  local_80 = this->m_joystickStates;
  local_a8 = (deque<sf::Event,std::allocator<sf::Event>> *)&this->m_events;
  pafVar21 = this->m_previousAxes;
  local_a0 = this->m_joystickStates[0].axes;
  pbVar19 = this->m_joystickStates[0].buttons;
  lVar22 = 0;
  local_88 = pafVar21;
  do {
    pJVar10 = local_80;
    local_b0 = lVar22 * 0x44;
    pJVar18 = local_80 + lVar22;
    pJVar12 = pJVar18;
    pbVar17 = local_74;
    for (lVar15 = 0x11; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar5 = pJVar12->field_0x1;
      uVar6 = pJVar12->field_0x2;
      uVar7 = pJVar12->field_0x3;
      pbVar17[0] = pJVar12->connected;
      pbVar17[1] = uVar5;
      pbVar17[2] = uVar6;
      pbVar17[3] = uVar7;
      pJVar12 = (JoystickState *)((long)pJVar12 + (ulong)bVar23 * -8 + 4);
      pbVar17 = pbVar17 + ((ulong)bVar23 * -2 + 1) * 4;
    }
    pJVar11 = JoystickManager::getInstance();
    joystick = (uint)lVar22;
    pJVar12 = JoystickManager::getState(pJVar11,joystick);
    for (lVar15 = 0x11; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar8 = *(undefined3 *)&pJVar12->field_0x1;
      pJVar18->connected = pJVar12->connected;
      *(undefined3 *)&pJVar18->field_0x1 = uVar8;
      pJVar12 = (JoystickState *)((long)pJVar12 + (ulong)bVar23 * -8 + 4);
      pJVar18 = (JoystickState *)((long)pJVar18 + (ulong)bVar23 * -8 + 4);
    }
    pJVar11 = JoystickManager::getInstance();
    pJVar13 = JoystickManager::getCapabilities(pJVar11,joystick);
    local_90 = *(undefined4 *)(pJVar13->axes + 4);
    local_98._0_4_ = pJVar13->buttonCount;
    local_98._4_1_ = pJVar13->axes[0];
    local_98._5_1_ = pJVar13->axes[1];
    local_98._6_1_ = pJVar13->axes[2];
    local_98._7_1_ = pJVar13->axes[3];
    bVar2 = *(byte *)((long)pJVar10->axes + local_b0 + -4);
    if (local_74[0] != bVar2) {
      local_c4.type = JoystickDisconnected - bVar2;
      pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pEVar4 == (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_c4.field_1.size.width = joystick;
        std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                  (local_a8,&local_c4);
      }
      else {
        (pEVar4->field_1).mouseWheelScroll.y = local_c4.field_1.mouseWheelScroll.y;
        *(ulong *)pEVar4 = CONCAT44(joystick,local_c4.type);
        *(ulong *)((long)&pEVar4->field_1 + 4) =
             CONCAT44(local_c4.field_1.mouseButton.y,local_c4.field_1.size.height);
        piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
        local_c4.field_1.size.width = joystick;
      }
      if (bVar2 != 0) {
        pafVar14 = local_88 + lVar22;
        *(float *)((long)pafVar14 + 0x10) = 0.0;
        *(float *)((long)pafVar14 + 0x14) = 0.0;
        *(float *)((long)pafVar14 + 0x18) = 0.0;
        *(float *)((long)pafVar14 + 0x1c) = 0.0;
        *(float *)((long)pafVar14 + 0) = 0.0;
        *(float *)((long)pafVar14 + 4) = 0.0;
        *(float *)((long)pafVar14 + 8) = 0.0;
        *(float *)((long)pafVar14 + 0xc) = 0.0;
      }
    }
    pfVar9 = local_a0;
    if (bVar2 != 0) {
      lVar15 = 0;
      do {
        if ((*(char *)((long)&local_98 + lVar15 + 4) == '\x01') &&
           (fVar24 = pfVar9[lVar15], this->m_joystickThreshold <= ABS(fVar24 - (*pafVar21)[lVar15]))
           ) {
          local_c4.type = JoystickMoved;
          local_c4.field_1.size.height = (uint)lVar15;
          pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_c4.field_1.joystickMove.position = fVar24;
          if (pEVar4 == (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            local_b0 = CONCAT44(local_b0._4_4_,fVar24);
            local_c4.field_1.size.width = joystick;
            std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                      (local_a8,&local_c4);
            fVar24 = (float)local_b0;
          }
          else {
            (pEVar4->field_1).mouseWheelScroll.y = local_c4.field_1.mouseWheelScroll.y;
            *(ulong *)pEVar4 = CONCAT44(joystick,0x10);
            *(ulong *)((long)&pEVar4->field_1 + 4) = CONCAT44(fVar24,local_c4.field_1.size.height);
            piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            local_c4.field_1.size.width = joystick;
          }
          (*pafVar21)[lVar15] = fVar24;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      uVar16 = local_98 & 0xffffffff;
      if (uVar16 != 0) {
        uVar20 = 0;
        do {
          bVar3 = pbVar19[uVar20];
          if ((bool)abStack_50[uVar20] != bVar3) {
            local_c4.type = bVar3 ^ JoystickButtonReleased;
            local_c4.field_1.size.height = (uint)uVar20;
            pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pEVar4 == (this->m_events).c.
                          super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_last + -1) {
              local_c4.field_1.size.width = joystick;
              std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                        (local_a8,&local_c4);
            }
            else {
              (pEVar4->field_1).mouseWheelScroll.y = local_c4.field_1.mouseWheelScroll.y;
              *(ulong *)pEVar4 = CONCAT44(joystick,(uint)bVar3) ^ 0xf;
              *(ulong *)((long)&pEVar4->field_1 + 4) =
                   CONCAT44(local_c4.field_1.mouseButton.y,local_c4.field_1.size.height);
              piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                        _M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
              local_c4.field_1.size.width = joystick;
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar16 != uVar20);
      }
    }
    lVar22 = lVar22 + 1;
    local_a0 = local_a0 + 0x11;
    pafVar21 = pafVar21 + 1;
    pbVar19 = pbVar19 + 0x44;
  } while (lVar22 != 8);
  return;
}

Assistant:

void WindowImpl::processJoystickEvents()
{
    // First update the global joystick states
    JoystickManager::getInstance().update();

    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        // Copy the previous state of the joystick and get the new one
        JoystickState previousState = m_joystickStates[i];
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);
        JoystickCaps caps = JoystickManager::getInstance().getCapabilities(i);

        // Connection state
        bool connected = m_joystickStates[i].connected;
        if (previousState.connected ^ connected)
        {
            Event event;
            event.type = connected ? Event::JoystickConnected : Event::JoystickDisconnected;
            event.joystickButton.joystickId = i;
            pushEvent(event);

            // Clear previous axes positions
            if (connected)
                std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
        }

        if (connected)
        {
            // Axes
            for (unsigned int j = 0; j < Joystick::AxisCount; ++j)
            {
                if (caps.axes[j])
                {
                    Joystick::Axis axis = static_cast<Joystick::Axis>(j);
                    float prevPos = m_previousAxes[i][axis];
                    float currPos = m_joystickStates[i].axes[axis];
                    if (fabs(currPos - prevPos) >= m_joystickThreshold)
                    {
                        Event event;
                        event.type = Event::JoystickMoved;
                        event.joystickMove.joystickId = i;
                        event.joystickMove.axis = axis;
                        event.joystickMove.position = currPos;
                        pushEvent(event);

                        m_previousAxes[i][axis] = currPos;
                    }
                }
            }

            // Buttons
            for (unsigned int j = 0; j < caps.buttonCount; ++j)
            {
                bool prevPressed = previousState.buttons[j];
                bool currPressed = m_joystickStates[i].buttons[j];

                if (prevPressed ^ currPressed)
                {
                    Event event;
                    event.type = currPressed ? Event::JoystickButtonPressed : Event::JoystickButtonReleased;
                    event.joystickButton.joystickId = i;
                    event.joystickButton.button = j;
                    pushEvent(event);
                }
            }
        }
    }
}